

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nva.c
# Opt level: O1

nva_card * nva_init_eth(pci_device *dev)

{
  int iVar1;
  nva_card *pnVar2;
  
  pnVar2 = (nva_card *)calloc(0x90,1);
  if (pnVar2 != (nva_card *)0x0) {
    pnVar2->type = NVA_DEVICE_ETH;
    pnVar2->bus_type = NVA_BUS_PCI;
    (pnVar2->bus).pci = dev;
    iVar1 = pci_device_map_range(dev,dev->regions[0].base_addr,dev->regions[0].size,1,&pnVar2->bar0)
    ;
    if (iVar1 == 0) {
      pnVar2->bar0len = dev->regions[0].size;
      return pnVar2;
    }
    nva_init_eth_cold_1();
  }
  return (nva_card *)0x0;
}

Assistant:

struct nva_card *nva_init_eth(struct pci_device *dev) {
	struct nva_card *card = calloc(sizeof *card, 1);
	if (!card)
		return 0;
	card->type = NVA_DEVICE_ETH;
	card->bus_type = NVA_BUS_PCI;
	card->bus.pci = dev;
	int ret = pci_device_map_range(dev, dev->regions[0].base_addr, dev->regions[0].size, PCI_DEV_MAP_FLAG_WRITABLE, &card->bar0);
	if (ret) {
		fprintf (stderr, "WARN: Can't probe %04x:%02x:%02x.%x\n", dev->domain, dev->bus, dev->dev, dev->func);
		free(card);
		return 0;
	}
	card->bar0len = dev->regions[0].size;
	return card;
}